

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

uint __thiscall
Strings::VerySimpleReadOnlyString::Find
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *needle,uint pos)

{
  uint uVar1;
  
  do {
    uVar1 = 0;
    while( true ) {
      if ((uint)this->length <= pos + uVar1) {
        return this->length;
      }
      if (needle->data[uVar1] != this->data[pos + uVar1]) break;
      uVar1 = uVar1 + 1;
      if (needle->length == uVar1) {
        return pos;
      }
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

const unsigned int VerySimpleReadOnlyString::Find(const VerySimpleReadOnlyString & needle, unsigned int pos) const
    {
	    for (unsigned int j = 0; pos + j < (unsigned int)length;)
	    {
		    if (needle.data[j] == data[pos + j])
		    {
			    j++;
			    if (j == (unsigned int)needle.length)	return pos;
			    continue;
		    }
		    pos++;
		    j = 0;
	    }
        return (unsigned int)length;
    }